

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void prvTidyResetConfigToDefault(TidyDocImpl *doc)

{
  ulong uVar1;
  TidyOptionValue *oldval;
  TidyOptionImpl *option;
  TidyOptionValue dflt;
  TidyOptionValue local_30;
  
  oldval = (doc->config).value;
  option = option_defs;
  uVar1 = 0;
  while( true ) {
    if (uVar1 == 0x60) {
      prvTidyFreeDeclaredTags(doc,tagtype_null);
      return;
    }
    if (uVar1 != option->id) break;
    if (option->type == TidyString) {
      local_30 = (TidyOptionValue)option->pdflt;
    }
    else {
      local_30 = (TidyOptionValue)option->dflt;
    }
    CopyOptionValue(doc,option,oldval,&local_30);
    option = option + 1;
    uVar1 = uVar1 + 1;
    oldval = oldval + 1;
  }
  __assert_fail("ixVal == (uint) option->id",
                "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/config.c"
                ,0x20c,"void prvTidyResetConfigToDefault(TidyDocImpl *)");
}

Assistant:

void TY_(ResetConfigToDefault)( TidyDocImpl* doc )
{
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    TidyOptionValue* value = &doc->config.value[ 0 ];
    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        TidyOptionValue dflt;
        assert( ixVal == (uint) option->id );
        GetOptionDefault( option, &dflt );
        CopyOptionValue( doc, option, &value[ixVal], &dflt );
    }
    TY_(FreeDeclaredTags)( doc, tagtype_null );
}